

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

Vec_Int_t * Cba_NtkCollectInFons(Cba_Ntk_t *p,Vec_Int_t *vObjs)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  undefined4 local_3c;
  int Entry;
  int iFon;
  int iFin;
  int iObj;
  int k;
  int i;
  Vec_Bit_t *vVisFons;
  Vec_Int_t *vFons;
  Vec_Int_t *vObjs_local;
  Cba_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = Cba_NtkFonNum(p);
  p_01 = Vec_BitStart(iVar1 + 1);
  for (iObj = 0; iVar1 = Vec_IntSize(vObjs), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vObjs,iObj);
    for (Entry = Cba_ObjFin0(p,iVar1); iVar2 = Cba_ObjFin0(p,iVar1 + 1), Entry < iVar2;
        Entry = Entry + 1) {
      iVar2 = Cba_FinFon(p,Entry);
      if (0 < iVar2) {
        Vec_BitWriteEntry(p_01,iVar2,1);
      }
    }
  }
  for (iObj = 0; iVar1 = Vec_IntSize(vObjs), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vObjs,iObj);
    for (local_3c = Cba_ObjFon0(p,iVar1); iVar2 = Cba_ObjFon0(p,iVar1 + 1), local_3c < iVar2;
        local_3c = local_3c + 1) {
      Vec_BitWriteEntry(p_01,local_3c,0);
    }
  }
  for (local_3c = 0; iVar1 = Vec_BitSize(p_01), local_3c < iVar1; local_3c = local_3c + 1) {
    iVar1 = Vec_BitEntry(p_01,local_3c);
    if (iVar1 != 0) {
      Vec_IntPush(p_00,local_3c);
    }
  }
  Vec_BitFree(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Cba_NtkCollectInFons( Cba_Ntk_t * p, Vec_Int_t * vObjs )
{
    Vec_Int_t * vFons = Vec_IntAlloc( 100 );
    Vec_Bit_t * vVisFons = Vec_BitStart( Cba_NtkFonNum(p) + 1 );
    int i, k, iObj, iFin, iFon, Entry;
    // mark fanin fons
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
            if ( iFon > 0 )
                Vec_BitWriteEntry( vVisFons, iFon, 1 );
    // unmark internal fons
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFon( p, iObj, iFon, k )
            Vec_BitWriteEntry( vVisFons, iFon, 0 );
    // collect fons
    Vec_BitForEachEntry( vVisFons, Entry, iFon )
        if ( Entry )
            Vec_IntPush( vFons, iFon );
    Vec_BitFree( vVisFons );
    return vFons;
}